

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::checkflipeligibility
          (tetgenmesh *this,int fliptype,point pa,point pb,point pc,point pd,point pe,int level,
          int edgepivot,flipconstraints *fc)

{
  point pa_00;
  point pb_00;
  int iVar1;
  uint uVar2;
  point pdVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  bool bVar7;
  double dVar8;
  int types [2];
  double cosmaxd;
  int local_6c;
  int poss [4];
  point tmppts [3];
  
  local_6c = fliptype;
  if (fc->seg[0] == (point)0x0) {
    uVar2 = 0;
LAB_001222c9:
    bVar7 = local_6c == 1;
    if (((bVar7) && (fc->fac[0] != (point)0x0)) && (uVar2 == 0)) {
      iVar1 = tri_edge_test(this,fc->fac[0],fc->fac[1],fc->fac[2],pe,pd,(point)0x0,1,types,poss);
      bVar7 = true;
      if (iVar1 == 2) {
        uVar2 = (uint)((types[0] & 0xfffffffeU) == 8);
      }
      else {
        uVar2 = 0;
        if (iVar1 == 4) {
          bVar7 = false;
          puVar6 = (uint *)types;
          do {
            uVar2 = *puVar6;
            if (bVar7) break;
            bVar7 = true;
            puVar6 = (uint *)(types + 1);
          } while ((uVar2 & 0xfffffffe) != 8);
          uVar2 = (uint)((uVar2 & 0xfffffffe) == 8);
          bVar7 = true;
        }
      }
    }
  }
  else if (fliptype == 2) {
    if (this->dummypoint == pc) {
      bVar7 = false;
      uVar2 = 0;
    }
    else {
      iVar1 = tri_edge_test(this,pa,pb,pc,fc->seg[0],fc->seg[1],(point)0x0,1,types,poss);
      if (iVar1 == 4) {
        uVar2 = (uint)(types[0] == 8);
        bVar7 = false;
      }
      else {
        bVar7 = false;
        uVar2 = 0;
        if (iVar1 == 2) {
          uVar2 = (uint)(types[0] == 9);
          bVar7 = false;
        }
      }
    }
  }
  else {
    bVar7 = false;
    uVar2 = 0;
    if (fliptype == 1) {
      tmppts[0] = pa;
      tmppts[1] = pb;
      tmppts[2] = pc;
      uVar5 = 0;
LAB_0012219e:
      if (tmppts[uVar5] == this->dummypoint) {
        bVar7 = false;
LAB_0012221b:
        if ((1 < uVar5) || (uVar5 = uVar5 + 1, bVar7 != false)) goto LAB_001222bd;
        goto LAB_0012219e;
      }
      iVar1 = tri_edge_test(this,pe,pd,tmppts[uVar5],fc->seg[0],fc->seg[1],(point)0x0,1,types,poss);
      if (iVar1 == 4) {
        bVar7 = types[0] == 8 && poss[0] == 0;
        goto LAB_0012221b;
      }
      if (iVar1 != 2) {
        bVar7 = false;
        goto LAB_0012221b;
      }
      if (types[0] != 9) {
        bVar7 = types[0] == 8 && poss[0] == 0;
        goto LAB_0012221b;
      }
      bVar7 = true;
LAB_001222bd:
      uVar2 = (uint)bVar7;
      goto LAB_001222c9;
    }
  }
  pdVar3 = fc->remvert;
  uVar4 = 1;
  if (pdVar3 != pe && pdVar3 != pd) {
    uVar4 = uVar2;
  }
  if (uVar2 != 0) {
    uVar4 = uVar2;
  }
  if (pdVar3 == (point)0x0) {
    uVar4 = uVar2;
  }
  if (!bVar7) {
    uVar4 = uVar2;
  }
  if (fc->remove_large_angle == 0) {
    return uVar4;
  }
  if (uVar4 != 0) {
    return uVar4;
  }
  cosmaxd = 0.0;
  if (bVar7) {
    pdVar3 = this->dummypoint;
    if (pdVar3 == pd) {
      return 0;
    }
    if (pdVar3 == pc) {
      return 0;
    }
    if (pdVar3 == pe) {
      return 0;
    }
    tetalldihedral(this,pe,pd,pb,pc,(double *)0x0,&cosmaxd,(double *)0x0);
    dVar8 = cosmaxd - fc->cosdihed_in;
    if (ABS(dVar8 / fc->cosdihed_in) < this->b->epsilon) {
      return 1;
    }
    if (dVar8 <= 0.0) {
      return 1;
    }
    pb = pe;
    pdVar3 = pa;
    if (cosmaxd < fc->cosdihed_out) {
      fc->cosdihed_out = cosmaxd;
    }
  }
  else {
    if (local_6c != 2) {
      return 0;
    }
    if (level != 0) {
      pdVar3 = this->dummypoint;
      pa_00 = pa;
      pb_00 = pb;
      if (edgepivot == 1) {
        pa_00 = pb;
        pb_00 = pa;
        pd = pe;
      }
      if (pdVar3 == pc || (pdVar3 == pb || pdVar3 == pa)) {
        return 0;
      }
      tetalldihedral(this,pa_00,pb_00,pc,pd,(double *)0x0,&cosmaxd,(double *)0x0);
      dVar8 = cosmaxd - fc->cosdihed_in;
      if (ABS(dVar8 / fc->cosdihed_in) < this->b->epsilon) {
        return 1;
      }
      goto LAB_00122670;
    }
    pdVar3 = this->dummypoint;
    if (pdVar3 == pc) {
      return 0;
    }
    if (pdVar3 == pa) {
      return 0;
    }
    if (pdVar3 == pb) {
      return 0;
    }
    tetalldihedral(this,pa,pb,pc,pd,(double *)0x0,&cosmaxd,(double *)0x0);
    dVar8 = cosmaxd - fc->cosdihed_in;
    if (ABS(dVar8 / fc->cosdihed_in) < this->b->epsilon) {
      return 1;
    }
    if (dVar8 <= 0.0) {
      return 1;
    }
    pd = pa;
    pdVar3 = pe;
    if (cosmaxd < fc->cosdihed_out) {
      fc->cosdihed_out = cosmaxd;
    }
  }
  tetalldihedral(this,pb,pd,pc,pdVar3,(double *)0x0,&cosmaxd,(double *)0x0);
  dVar8 = cosmaxd - fc->cosdihed_in;
  if (ABS(dVar8 / fc->cosdihed_in) < this->b->epsilon) {
    return 1;
  }
LAB_00122670:
  iVar1 = 1;
  if ((0.0 < dVar8) && (iVar1 = 0, cosmaxd < fc->cosdihed_out)) {
    fc->cosdihed_out = cosmaxd;
  }
  return iVar1;
}

Assistant:

int tetgenmesh::checkflipeligibility(int fliptype, point pa, point pb, 
                                     point pc, point pd, point pe,
                                     int level, int edgepivot,
                                     flipconstraints* fc)
{
  point tmppts[3];
  enum interresult dir;
  int types[2], poss[4];
  int intflag;
  int rejflag = 0;
  int i;

  if (fc->seg[0] != NULL) {
    // A constraining edge is given (e.g., for edge recovery).
    if (fliptype == 1) {
      // A 2-to-3 flip: [a,b,c] => [e,d,a], [e,d,b], [e,d,c].
      tmppts[0] = pa;
      tmppts[1] = pb;
      tmppts[2] = pc;
      for (i = 0; i < 3 && !rejflag; i++) {
        if (tmppts[i] != dummypoint) {
          // Test if the face [e,d,#] intersects the edge.
          intflag = tri_edge_test(pe, pd, tmppts[i], fc->seg[0], fc->seg[1], 
                                  NULL, 1, types, poss);
          if (intflag == 2) {
            // They intersect at a single point.
            dir = (enum interresult) types[0];
            if (dir == ACROSSFACE) {
              // The interior of [e,d,#] intersect the segment.
              rejflag = 1;
            } else if (dir == ACROSSEDGE) {
              if (poss[0] == 0) {
                // The interior of [e,d] intersect the segment.
                // Since [e,d] is the newly created edge. Reject this flip.
                rejflag = 1; 
              }
            }
          } else if (intflag == 4) {
            // They may intersect at either a point or a line segment.
            dir = (enum interresult) types[0];
            if (dir == ACROSSEDGE) {
              if (poss[0] == 0) {
                // The interior of [e,d] intersect the segment.
                // Since [e,d] is the newly created edge. Reject this flip.
                rejflag = 1;
              }
            }
          }
        } // if (tmppts[0] != dummypoint)
      } // i
    } else if (fliptype == 2) {
      // A 3-to-2 flip: [e,d,a], [e,d,b], [e,d,c] => [a,b,c]
      if (pc != dummypoint) {
        // Check if the new face [a,b,c] intersect the edge in its interior.
        intflag = tri_edge_test(pa, pb, pc, fc->seg[0], fc->seg[1], NULL, 
                                1, types, poss);
        if (intflag == 2) {
          // They intersect at a single point.
          dir = (enum interresult) types[0];
          if (dir == ACROSSFACE) {
            // The interior of [a,b,c] intersect the segment.
            rejflag = 1; // Do not flip.
          }
        } else if (intflag == 4) {
          // [a,b,c] is coplanar with the edge. 
          dir = (enum interresult) types[0];
          if (dir == ACROSSEDGE) {
            // The boundary of [a,b,c] intersect the segment.            
            rejflag = 1; // Do not flip.
          }
        }
      } // if (pc != dummypoint)
    }
  } // if (fc->seg[0] != NULL)

  if ((fc->fac[0] != NULL) && !rejflag) {
    // A constraining face is given (e.g., for face recovery).
    if (fliptype == 1) {
      // A 2-to-3 flip.
      // Test if the new edge [e,d] intersects the face.
      intflag = tri_edge_test(fc->fac[0], fc->fac[1], fc->fac[2], pe, pd, 
                              NULL, 1, types, poss);
      if (intflag == 2) {
        // They intersect at a single point.
        dir = (enum interresult) types[0];
        if (dir == ACROSSFACE) {
          rejflag = 1;
        } else if (dir == ACROSSEDGE) {
          rejflag = 1;
        } 
      } else if (intflag == 4) {
        // The edge [e,d] is coplanar with the face.
        // There may be two intersections.
        for (i = 0; i < 2 && !rejflag; i++) {
          dir = (enum interresult) types[i];
          if (dir == ACROSSFACE) {
            rejflag = 1;
          } else if (dir == ACROSSEDGE) {
            rejflag = 1;
          }
        }
      }
    } // if (fliptype == 1)
  } // if (fc->fac[0] != NULL)

  if ((fc->remvert != NULL) && !rejflag) {
    // The vertex is going to be removed. Do not create a new edge which
    //   contains this vertex.
    if (fliptype == 1) {
      // A 2-to-3 flip.
      if ((pd == fc->remvert) || (pe == fc->remvert)) {
        rejflag = 1;
      }
    }
  }

  if (fc->remove_large_angle && !rejflag) {
    // Remove a large dihedral angle. Do not create a new small angle.
    REAL cosmaxd = 0, diff;
    if (fliptype == 1) {
      // We assume that neither 'a' nor 'b' is dummypoint.
      // A 2-to-3 flip: [a,b,c] => [e,d,a], [e,d,b], [e,d,c].
      // The new tet [e,d,a,b] will be flipped later. Only two new tets:
      //   [e,d,b,c] and [e,d,c,a] need to be checked.
      if ((pc != dummypoint) && (pe != dummypoint) && (pd != dummypoint)) {
        // Get the largest dihedral angle of [e,d,b,c].
        tetalldihedral(pe, pd, pb, pc, NULL, &cosmaxd, NULL);
        diff = cosmaxd - fc->cosdihed_in;
        if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding.
        if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
          rejflag = 1;
        } else {
          // Record the largest new angle.
          if (cosmaxd < fc->cosdihed_out) {
            fc->cosdihed_out = cosmaxd; 
          }
          // Get the largest dihedral angle of [e,d,c,a].
          tetalldihedral(pe, pd, pc, pa, NULL, &cosmaxd, NULL);
          diff = cosmaxd - fc->cosdihed_in;
          if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding.
          if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
            rejflag = 1;
          } else {
            // Record the largest new angle.
            if (cosmaxd < fc->cosdihed_out) {
              fc->cosdihed_out = cosmaxd; 
            }
          }
        }
      } // if (pc != dummypoint && ...)
    } else if (fliptype == 2) {
      // A 3-to-2 flip: [e,d,a], [e,d,b], [e,d,c] => [a,b,c]
      // We assume that neither 'e' nor 'd' is dummypoint.
      if (level == 0) {
        // Both new tets [a,b,c,d] and [b,a,c,e] are new tets.
        if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
          // Get the largest dihedral angle of [a,b,c,d].
          tetalldihedral(pa, pb, pc, pd, NULL, &cosmaxd, NULL);
          diff = cosmaxd - fc->cosdihed_in;
          if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding
          if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
            rejflag = 1;
          } else {
            // Record the largest new angle.
            if (cosmaxd < fc->cosdihed_out) {
              fc->cosdihed_out = cosmaxd; 
            }
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pb, pa, pc, pe, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        }
      } else { // level > 0
        if (edgepivot == 1) {
          // The new tet [a,b,c,d] will be flipped. Only check [b,a,c,e].
          if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pb, pa, pc, pe, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        } else {
          // The new tet [b,a,c,e] will be flipped. Only check [a,b,c,d].
          if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pa, pb, pc, pd, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        } // edgepivot
      } // level
    }
  }

  return rejflag;
}